

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O0

void write_wdseg(char *dir,align_wdseg_t *wdseg,char *uttid,char *ctlspec)

{
  uint local_434;
  FILE *pFStack_430;
  int32 uttscr;
  FILE *fp;
  char str [1024];
  char *ctlspec_local;
  char *uttid_local;
  align_wdseg_t *wdseg_local;
  char *dir_local;
  
  str._1016_8_ = ctlspec;
  build_output_uttfile((char *)&fp,dir,uttid,ctlspec);
  strcat((char *)&fp,".wdseg");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
          ,599,"Writing word segmentation to: %s\n",&fp);
  pFStack_430 = fopen((char *)&fp,"w");
  wdseg_local = (align_wdseg_t *)dir;
  if (pFStack_430 == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                   ,0x259,"Failed to open file %s for writing",&fp);
    pFStack_430 = _stdout;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
            ,0x25b,"Word segmentation (%s):\n",uttid);
    wdseg_local = (align_wdseg_t *)0x0;
  }
  if (wdseg_local == (align_wdseg_t *)0x0) {
    fprintf(pFStack_430,"WD:%s>",uttid);
    fflush(pFStack_430);
  }
  fprintf(pFStack_430,"\t%5s %5s %10s %s\n","SFrm","EFrm","SegAScr","Word");
  fflush(pFStack_430);
  local_434 = 0;
  for (uttid_local = (char *)wdseg; uttid_local != (char *)0x0;
      uttid_local = *(char **)(uttid_local + 0x10)) {
    if (wdseg_local == (align_wdseg_t *)0x0) {
      fprintf(pFStack_430,"wd:%s>",uttid);
      fflush(pFStack_430);
    }
    fprintf(pFStack_430,"\t%5d %5d %10d %s\n",(ulong)(uint)(int)*(short *)(uttid_local + 4),
            (ulong)(uint)(int)*(short *)(uttid_local + 6),(ulong)*(uint *)(uttid_local + 8),
            dict->word[*(int *)uttid_local].word);
    fflush(pFStack_430);
    local_434 = *(int *)(uttid_local + 8) + local_434;
  }
  if (wdseg_local == (align_wdseg_t *)0x0) {
    fprintf(pFStack_430,"WD:%s>",uttid);
    fflush(pFStack_430);
  }
  fprintf(pFStack_430," Total score: %11d\n",(ulong)local_434);
  fflush(pFStack_430);
  if (wdseg_local == (align_wdseg_t *)0x0) {
    fprintf(pFStack_430,"\n");
    fflush(pFStack_430);
  }
  else {
    fclose(pFStack_430);
  }
  return;
}

Assistant:

static void
write_wdseg(char *dir, align_wdseg_t * wdseg, char *uttid, char *ctlspec)
{
    char str[1024];
    FILE *fp;
    int32 uttscr;

    /* Attempt to write segmentation for this utt to a separate file */
    build_output_uttfile(str, dir, uttid, ctlspec);
    strcat(str, ".wdseg");
    E_INFO("Writing word segmentation to: %s\n", str);
    if ((fp = fopen(str, "w")) == NULL) {
        E_ERROR_SYSTEM("Failed to open file %s for writing", str);
        fp = stdout;            /* Segmentations can be directed to stdout this way */
        E_INFO("Word segmentation (%s):\n", uttid);
        dir = NULL;             /* Flag to indicate fp shouldn't be closed at the end */
    }

    if (!dir) {
        fprintf(fp, "WD:%s>", uttid);
        fflush(fp);
    }
    fprintf(fp, "\t%5s %5s %10s %s\n", "SFrm", "EFrm", "SegAScr", "Word");
    fflush(fp);
    uttscr = 0;
    for (; wdseg; wdseg = wdseg->next) {
        if (!dir) {
            fprintf(fp, "wd:%s>", uttid);
            fflush(fp);
        }
        fprintf(fp, "\t%5d %5d %10d %s\n",
                wdseg->sf, wdseg->ef, wdseg->score,
                dict_wordstr(dict, wdseg->wid));
        fflush(fp);


        uttscr += wdseg->score;
    }

    if (!dir) {
        fprintf(fp, "WD:%s>", uttid);
        fflush(fp);
    }

    fprintf(fp, " Total score: %11d\n", uttscr);
    fflush(fp);
    if (dir)
        fclose(fp);
    else {
        fprintf(fp, "\n");
        fflush(fp);
    }
}